

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Status __thiscall leveldb::VersionSet::Recover(VersionSet *this,bool *save_manifest)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  bool bVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  bool bVar8;
  undefined1 uVar9;
  int iVar10;
  Version *v_00;
  undefined4 extraout_var;
  VersionSet *this_00;
  undefined1 *in_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  Version *v;
  uint64_t prev_log_number;
  uint64_t log_number;
  uint64_t last_sequence;
  uint64_t next_file;
  bool have_last_sequence;
  bool have_next_file;
  bool have_prev_log_number;
  bool have_log_number;
  Slice record;
  LogReporter reporter;
  SequentialFile *file;
  Status s;
  Reader reader;
  VersionEdit edit;
  string scratch;
  Builder builder;
  string dscname;
  string current;
  VersionEdit *in_stack_fffffffffffffa28;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  VersionSet *in_stack_fffffffffffffa38;
  undefined6 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa46;
  undefined1 in_stack_fffffffffffffa47;
  Reader *in_stack_fffffffffffffa48;
  Version *this_01;
  VersionEdit *in_stack_fffffffffffffa58;
  Version *in_stack_fffffffffffffa60;
  undefined7 in_stack_fffffffffffffa68;
  undefined1 in_stack_fffffffffffffa6f;
  Builder *in_stack_fffffffffffffa80;
  Version *in_stack_fffffffffffffa88;
  VersionSet *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa9c;
  undefined1 in_stack_fffffffffffffa9d;
  undefined1 in_stack_fffffffffffffa9e;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffffa9f;
  VersionEdit *edit_00;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  string *in_stack_fffffffffffffab0;
  string *scratch_00;
  string *in_stack_fffffffffffffab8;
  VersionEdit *this_02;
  undefined7 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac7;
  undefined7 in_stack_fffffffffffffae0;
  undefined8 local_4f0;
  pointer local_4e8;
  undefined8 local_4e0;
  long local_4d8;
  undefined1 local_3e8 [56];
  Version *local_3b0 [5];
  VersionEdit local_388;
  undefined8 local_2e0;
  long local_2d8;
  undefined8 local_2d0;
  byte local_2c8;
  byte local_2c7;
  byte local_2c6;
  byte local_2c5;
  byte local_2c4;
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa47,
                      CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
  CurrentFileName((string *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
  ReadFileToString((Env *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
                   in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::__cxx11::string::~string(&in_stack_fffffffffffffa28->comparator_);
  uVar4 = Status::ok((Status *)in_stack_fffffffffffffa28);
  if ((bool)uVar4) {
    bVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&in_stack_fffffffffffffa28->comparator_);
    if (!bVar5) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (&in_stack_fffffffffffffa28->comparator_);
      v_00 = (Version *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffa38,
                        CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
      if (*(char *)&v_00->vset_ == '\n') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  (&in_stack_fffffffffffffa28->comparator_);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  (&in_stack_fffffffffffffa28->comparator_,0x18afc5d);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffa47,
                                CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa38);
        std::__cxx11::string::~string(&in_stack_fffffffffffffa28->comparator_);
        (**(code **)(*(long *)*in_RSI + 0x10))(local_3e8 + 0x30,(long *)*in_RSI,local_68,local_3b0);
        this_02 = &local_388;
        scratch_00 = (string *)(local_3e8 + 0x30);
        Status::operator=((Status *)in_stack_fffffffffffffa38,
                          (Status *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
        Status::~Status((Status *)in_stack_fffffffffffffa28);
        uVar6 = Status::ok((Status *)in_stack_fffffffffffffa28);
        if ((bool)uVar6) {
          bVar1 = false;
          bVar3 = false;
          bVar5 = false;
          bVar2 = false;
          local_4d8 = 0;
          local_4e0 = 0;
          local_4e8 = (pointer)0x0;
          local_4f0 = 0;
          Builder::Builder((Builder *)
                           CONCAT17(in_stack_fffffffffffffa9f,
                                    CONCAT16(in_stack_fffffffffffffa9e,
                                             CONCAT15(in_stack_fffffffffffffa9d,
                                                      CONCAT14(in_stack_fffffffffffffa9c,
                                                               in_stack_fffffffffffffa98)))),
                           in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
          edit_00 = (VersionEdit *)local_3e8;
          Recover::LogReporter::LogReporter((LogReporter *)in_stack_fffffffffffffa28);
          local_3e8._8_8_ = &local_388;
          log::Reader::Reader(in_stack_fffffffffffffa48,
                              (SequentialFile *)
                              CONCAT17(in_stack_fffffffffffffa47,
                                       CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)
                                      ),(Reporter *)in_stack_fffffffffffffa38,
                              (bool)in_stack_fffffffffffffa37,(uint64_t)in_stack_fffffffffffffa28);
          Slice::Slice((Slice *)in_stack_fffffffffffffa28);
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa47,
                              CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
          while( true ) {
            uVar7 = log::Reader::ReadRecord
                              ((Reader *)CONCAT17(uVar6,in_stack_fffffffffffffac0),(Slice *)this_02,
                               scratch_00);
            uVar11 = false;
            if ((bool)uVar7) {
              in_stack_fffffffffffffa9d = Status::ok((Status *)in_stack_fffffffffffffa28);
              uVar11 = in_stack_fffffffffffffa9d;
            }
            if ((bool)uVar11 == false) break;
            VersionEdit::VersionEdit(in_stack_fffffffffffffa58);
            VersionEdit::DecodeFrom(this_02,(Slice *)scratch_00);
            Status::operator=((Status *)in_stack_fffffffffffffa38,
                              (Status *)
                              CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
            Status::~Status((Status *)in_stack_fffffffffffffa28);
            in_stack_fffffffffffffa9c = Status::ok((Status *)in_stack_fffffffffffffa28);
            if (((bool)in_stack_fffffffffffffa9c) && ((local_2c8 & 1) != 0)) {
              in_stack_fffffffffffffa80 =
                   (Builder *)
                   InternalKeyComparator::user_comparator
                             ((InternalKeyComparator *)in_stack_fffffffffffffa28);
              (*(code *)(in_stack_fffffffffffffa80->vset_->dbname_).field_2._M_allocated_capacity)()
              ;
              in_stack_fffffffffffffa6f =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffa38,
                                   (char *)CONCAT17(in_stack_fffffffffffffa37,
                                                    in_stack_fffffffffffffa30));
              if (((in_stack_fffffffffffffa6f ^ 0xff) & 1) != 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
                Slice::Slice((Slice *)in_stack_fffffffffffffa38,
                             (string *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30)
                            );
                in_stack_fffffffffffffa60 =
                     (Version *)
                     InternalKeyComparator::user_comparator
                               ((InternalKeyComparator *)in_stack_fffffffffffffa28);
                iVar10 = (**(_func_int **)
                            ((long)((_Alloc_hider *)&in_stack_fffffffffffffa60->vset_)->_M_p + 0x18)
                         )();
                in_stack_fffffffffffffa58 = (VersionEdit *)CONCAT44(extraout_var,iVar10);
                Slice::Slice((Slice *)in_stack_fffffffffffffa38,
                             (char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
                Status::InvalidArgument
                          ((Slice *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                           (Slice *)in_stack_fffffffffffffa28);
                Status::operator=((Status *)in_stack_fffffffffffffa38,
                                  (Status *)
                                  CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
                Status::~Status((Status *)in_stack_fffffffffffffa28);
                std::__cxx11::string::~string(&in_stack_fffffffffffffa28->comparator_);
              }
            }
            bVar8 = Status::ok((Status *)in_stack_fffffffffffffa28);
            if (bVar8) {
              Builder::Apply((Builder *)
                             CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),edit_00);
            }
            if ((local_2c7 & 1) != 0) {
              local_4e8 = local_388.new_files_.
                          super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              bVar1 = true;
            }
            if ((local_2c6 & 1) != 0) {
              local_4f0 = local_2e0;
              bVar3 = true;
            }
            if ((local_2c5 & 1) != 0) {
              local_4d8 = local_2d8;
              bVar5 = true;
            }
            if ((local_2c4 & 1) != 0) {
              local_4e0 = local_2d0;
              bVar2 = true;
            }
            VersionEdit::~VersionEdit(in_stack_fffffffffffffa28);
          }
          std::__cxx11::string::~string(&in_stack_fffffffffffffa28->comparator_);
          log::Reader::~Reader((Reader *)in_stack_fffffffffffffa28);
          Recover::LogReporter::~LogReporter((LogReporter *)in_stack_fffffffffffffa28);
          this_01 = local_3b0[0];
          if (local_3b0[0] != (Version *)0x0) {
            (*(code *)(local_3b0[0]->vset_->dbname_)._M_dataplus._M_p)();
            this_01 = local_3b0[0];
          }
          local_3b0[0] = (Version *)0x0;
          uVar6 = Status::ok((Status *)in_stack_fffffffffffffa28);
          if ((bool)uVar6) {
            if (bVar5) {
              if (bVar1) {
                if (!bVar2) {
                  Slice::Slice((Slice *)in_stack_fffffffffffffa38,
                               (char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30)
                              );
                  Slice::Slice((Slice *)in_stack_fffffffffffffa28);
                  Status::Corruption((Slice *)CONCAT17(in_stack_fffffffffffffa37,
                                                       in_stack_fffffffffffffa30),
                                     (Slice *)in_stack_fffffffffffffa28);
                  Status::operator=((Status *)in_stack_fffffffffffffa38,
                                    (Status *)
                                    CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
                  Status::~Status((Status *)in_stack_fffffffffffffa28);
                }
              }
              else {
                Slice::Slice((Slice *)in_stack_fffffffffffffa38,
                             (char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
                Slice::Slice((Slice *)in_stack_fffffffffffffa28);
                Status::Corruption((Slice *)CONCAT17(in_stack_fffffffffffffa37,
                                                     in_stack_fffffffffffffa30),
                                   (Slice *)in_stack_fffffffffffffa28);
                Status::operator=((Status *)in_stack_fffffffffffffa38,
                                  (Status *)
                                  CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
                Status::~Status((Status *)in_stack_fffffffffffffa28);
              }
            }
            else {
              Slice::Slice((Slice *)in_stack_fffffffffffffa38,
                           (char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
              Slice::Slice((Slice *)in_stack_fffffffffffffa28);
              Status::Corruption((Slice *)CONCAT17(in_stack_fffffffffffffa37,
                                                   in_stack_fffffffffffffa30),
                                 (Slice *)in_stack_fffffffffffffa28);
              Status::operator=((Status *)in_stack_fffffffffffffa38,
                                (Status *)
                                CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
              Status::~Status((Status *)in_stack_fffffffffffffa28);
            }
            if (!bVar3) {
              local_4f0 = 0;
            }
            MarkFileNumberUsed(in_stack_fffffffffffffa38,
                               CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
            MarkFileNumberUsed(in_stack_fffffffffffffa38,
                               CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
          }
          uVar9 = Status::ok((Status *)in_stack_fffffffffffffa28);
          if ((bool)uVar9) {
            this_00 = (VersionSet *)operator_new(0xe8);
            Version::Version(this_01,(VersionSet *)
                                     CONCAT17(uVar6,CONCAT16(uVar9,in_stack_fffffffffffffa40)));
            Builder::SaveTo((Builder *)CONCAT17(uVar4,in_stack_fffffffffffffae0),v_00);
            Finalize((VersionSet *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
                     in_stack_fffffffffffffa60);
            AppendVersion(this_00,(Version *)
                                  CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
            in_RSI[10] = local_4d8;
            in_RSI[9] = local_4d8 + 1;
            in_RSI[0xb] = local_4e0;
            in_RSI[0xc] = local_4e8;
            in_RSI[0xd] = local_4f0;
            bVar5 = ReuseManifest((VersionSet *)
                                  CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                                  &edit_00->comparator_,
                                  (string *)
                                  CONCAT17(uVar7,CONCAT16(uVar11,CONCAT15(in_stack_fffffffffffffa9d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffa9c,
                                                  in_stack_fffffffffffffa98)))));
            if (!bVar5) {
              *in_RDX = 1;
            }
          }
          Status::Status((Status *)in_stack_fffffffffffffa28,(Status *)0x18b0678);
          Builder::~Builder(in_stack_fffffffffffffa80);
        }
        else {
          bVar5 = Status::IsNotFound((Status *)in_stack_fffffffffffffa28);
          if (bVar5) {
            Slice::Slice((Slice *)in_stack_fffffffffffffa38,
                         (char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
            Status::ToString_abi_cxx11_((Status *)in_stack_fffffffffffffa88);
            Slice::Slice((Slice *)in_stack_fffffffffffffa38,
                         (string *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
            Status::Corruption((Slice *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30
                                                ),(Slice *)in_stack_fffffffffffffa28);
            std::__cxx11::string::~string(&in_stack_fffffffffffffa28->comparator_);
          }
          else {
            Status::Status((Status *)in_stack_fffffffffffffa28,(Status *)0x18afe60);
          }
        }
        std::__cxx11::string::~string(&in_stack_fffffffffffffa28->comparator_);
        goto LAB_018b06bf;
      }
    }
    Slice::Slice((Slice *)in_stack_fffffffffffffa38,
                 (char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30));
    Slice::Slice((Slice *)in_stack_fffffffffffffa28);
    Status::Corruption((Slice *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
                       (Slice *)in_stack_fffffffffffffa28);
  }
  else {
    Status::Status((Status *)in_stack_fffffffffffffa28,(Status *)0x18afb1a);
  }
LAB_018b06bf:
  Status::~Status((Status *)in_stack_fffffffffffffa28);
  std::__cxx11::string::~string(&in_stack_fffffffffffffa28->comparator_);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Status)in_RDI;
}

Assistant:

Status VersionSet::Recover(bool* save_manifest) {
  struct LogReporter : public log::Reader::Reporter {
    Status* status;
    void Corruption(size_t bytes, const Status& s) override {
      if (this->status->ok()) *this->status = s;
    }
  };

  // Read "CURRENT" file, which contains a pointer to the current manifest file
  std::string current;
  Status s = ReadFileToString(env_, CurrentFileName(dbname_), &current);
  if (!s.ok()) {
    return s;
  }
  if (current.empty() || current[current.size() - 1] != '\n') {
    return Status::Corruption("CURRENT file does not end with newline");
  }
  current.resize(current.size() - 1);

  std::string dscname = dbname_ + "/" + current;
  SequentialFile* file;
  s = env_->NewSequentialFile(dscname, &file);
  if (!s.ok()) {
    if (s.IsNotFound()) {
      return Status::Corruption("CURRENT points to a non-existent file",
                                s.ToString());
    }
    return s;
  }

  bool have_log_number = false;
  bool have_prev_log_number = false;
  bool have_next_file = false;
  bool have_last_sequence = false;
  uint64_t next_file = 0;
  uint64_t last_sequence = 0;
  uint64_t log_number = 0;
  uint64_t prev_log_number = 0;
  Builder builder(this, current_);

  {
    LogReporter reporter;
    reporter.status = &s;
    log::Reader reader(file, &reporter, true /*checksum*/,
                       0 /*initial_offset*/);
    Slice record;
    std::string scratch;
    while (reader.ReadRecord(&record, &scratch) && s.ok()) {
      VersionEdit edit;
      s = edit.DecodeFrom(record);
      if (s.ok()) {
        if (edit.has_comparator_ &&
            edit.comparator_ != icmp_.user_comparator()->Name()) {
          s = Status::InvalidArgument(
              edit.comparator_ + " does not match existing comparator ",
              icmp_.user_comparator()->Name());
        }
      }

      if (s.ok()) {
        builder.Apply(&edit);
      }

      if (edit.has_log_number_) {
        log_number = edit.log_number_;
        have_log_number = true;
      }

      if (edit.has_prev_log_number_) {
        prev_log_number = edit.prev_log_number_;
        have_prev_log_number = true;
      }

      if (edit.has_next_file_number_) {
        next_file = edit.next_file_number_;
        have_next_file = true;
      }

      if (edit.has_last_sequence_) {
        last_sequence = edit.last_sequence_;
        have_last_sequence = true;
      }
    }
  }
  delete file;
  file = nullptr;

  if (s.ok()) {
    if (!have_next_file) {
      s = Status::Corruption("no meta-nextfile entry in descriptor");
    } else if (!have_log_number) {
      s = Status::Corruption("no meta-lognumber entry in descriptor");
    } else if (!have_last_sequence) {
      s = Status::Corruption("no last-sequence-number entry in descriptor");
    }

    if (!have_prev_log_number) {
      prev_log_number = 0;
    }

    MarkFileNumberUsed(prev_log_number);
    MarkFileNumberUsed(log_number);
  }

  if (s.ok()) {
    Version* v = new Version(this);
    builder.SaveTo(v);
    // Install recovered version
    Finalize(v);
    AppendVersion(v);
    manifest_file_number_ = next_file;
    next_file_number_ = next_file + 1;
    last_sequence_ = last_sequence;
    log_number_ = log_number;
    prev_log_number_ = prev_log_number;

    // See if we can reuse the existing MANIFEST file.
    if (ReuseManifest(dscname, current)) {
      // No need to save new manifest
    } else {
      *save_manifest = true;
    }
  }

  return s;
}